

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

__m256i * highbd_comp_avg(__m256i *data_ref_0,__m256i *res_unsigned,__m256i *wt0,__m256i *wt1,
                         int use_dist_wtd_comp_avg)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  int in_R8D;
  __m256i wt_res_1;
  __m256i wt_res;
  __m256i wt1_res;
  __m256i wt0_res;
  __m256i res;
  
  if (in_R8D == 0) {
    auVar2 = vpaddd_avx2(*in_RDI,*in_RSI);
    uVar1 = 1;
    vpsrad_avx2(auVar2,ZEXT416(1));
  }
  else {
    auVar2 = vpmulld_avx2(*in_RDI,*in_RDX);
    auVar3 = vpmulld_avx2(*in_RSI,*in_RCX);
    auVar2 = vpaddd_avx2(auVar2,auVar3);
    uVar1 = 4;
    vpsrad_avx2(auVar2,ZEXT416(4));
  }
  return (__m256i *)(ulong)uVar1;
}

Assistant:

static inline __m256i highbd_comp_avg(const __m256i *const data_ref_0,
                                      const __m256i *const res_unsigned,
                                      const __m256i *const wt0,
                                      const __m256i *const wt1,
                                      const int use_dist_wtd_comp_avg) {
  __m256i res;
  if (use_dist_wtd_comp_avg) {
    const __m256i wt0_res = _mm256_mullo_epi32(*data_ref_0, *wt0);
    const __m256i wt1_res = _mm256_mullo_epi32(*res_unsigned, *wt1);
    const __m256i wt_res = _mm256_add_epi32(wt0_res, wt1_res);
    res = _mm256_srai_epi32(wt_res, DIST_PRECISION_BITS);
  } else {
    const __m256i wt_res = _mm256_add_epi32(*data_ref_0, *res_unsigned);
    res = _mm256_srai_epi32(wt_res, 1);
  }
  return res;
}